

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O1

int mbedtls_hmac_drbg_update_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t add_len;
  size_t sVar3;
  uchar c;
  uchar buf [256];
  undefined1 local_129;
  uchar local_128 [256];
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -7;
  }
  else {
    add_len = fread(local_128,1,0x100,__stream);
    sVar3 = fread(&local_129,1,1,__stream);
    iVar1 = -5;
    if ((sVar3 == 0) && (iVar1 = -7, add_len != 0)) {
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        fclose(__stream);
        iVar1 = mbedtls_hmac_drbg_update_ret(ctx,local_128,add_len);
        __stream = (FILE *)0x0;
      }
    }
    mbedtls_platform_zeroize(local_128,0x100);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (iVar1 == 0) {
      iVar1 = mbedtls_hmac_drbg_write_seed_file(ctx,path);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_update_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    int ret = 0;
    FILE *f = NULL;
    size_t n;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];
    unsigned char c;

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    n = fread( buf, 1, sizeof( buf ), f );
    if( fread( &c, 1, 1, f ) != 0 )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG;
        goto exit;
    }
    if( n == 0 || ferror( f ) )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR;
        goto exit;
    }
    fclose( f );
    f = NULL;

    ret = mbedtls_hmac_drbg_update_ret( ctx, buf, n );

exit:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );
    if( f != NULL )
        fclose( f );
    if( ret != 0 )
        return( ret );
    return( mbedtls_hmac_drbg_write_seed_file( ctx, path ) );
}